

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_chain_pdf2
          (Impl *this,void *pNext,ScratchAllocator *alloc,void **out_pnext)

{
  uint uVar1;
  Impl *pNext_00;
  bool bVar2;
  Impl *this_00;
  undefined4 *puVar3;
  VkPhysicalDeviceRobustness2FeaturesEXT *new_data;
  void **ppvVar4;
  VkPhysicalDeviceRobustness2FeaturesEXT *ci;
  long *in_FS_OFFSET;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  void *local_38;
  
  ppvVar4 = &local_38;
  local_38 = (void *)0x0;
  this_00 = (Impl *)pnext_chain_pdf2_skip_ignored_entries(pNext);
  if (this_00 == (Impl *)0x0) {
    local_38 = (void *)0x0;
  }
  else {
    do {
      uVar1 = *(uint *)&(this_00->allocator).impl;
      if ((int)uVar1 < 0x3b9fcb40) {
        if ((int)uVar1 < 0x3b9f2730) {
          if (uVar1 == 0x3b9ddf10) goto LAB_0012d02c;
          if (uVar1 != 0x3b9e3cd3) goto LAB_0012d0d2;
        }
        else if (((uVar1 != 0x3b9f2730) && (uVar1 != 0x3b9f9c62)) && (uVar1 != 0x3b9fc371)) {
LAB_0012d0d2:
          if (*(int *)(*in_FS_OFFSET + -0x18) < 3) {
            bVar2 = Internal::log_thread_callback
                              (LOG_ERROR,"Cannot copy unknown pNext sType: %d.\n",(ulong)uVar1);
            if (bVar2) {
              return false;
            }
            copy_pnext_chain_pdf2(this_00);
          }
          return false;
        }
LAB_0012cfed:
        puVar3 = (undefined4 *)ScratchAllocator::allocate_raw(alloc,0x20,0x10);
        if (puVar3 != (undefined4 *)0x0) {
          uVar5 = *(undefined4 *)&(this_00->allocator).impl;
          uVar6 = *(undefined4 *)((long)&(this_00->allocator).impl + 4);
          uVar7 = *(undefined4 *)&(this_00->temp_allocator).impl;
          uVar8 = *(undefined4 *)((long)&(this_00->temp_allocator).impl + 4);
          uVar9 = *(undefined4 *)&(this_00->ycbcr_temp_allocator).impl;
          uVar10 = *(undefined4 *)((long)&(this_00->ycbcr_temp_allocator).impl + 4);
          uVar11 = *(undefined4 *)&this_00->database_iface;
          uVar12 = *(undefined4 *)((long)&this_00->database_iface + 4);
LAB_0012d010:
          puVar3[4] = uVar9;
          puVar3[5] = uVar10;
          puVar3[6] = uVar11;
          puVar3[7] = uVar12;
          goto LAB_0012d053;
        }
      }
      else {
        if (0x3ba09e2f < (int)uVar1) {
          if (uVar1 != 0x3ba09e30) {
            if ((uVar1 != 0x3ba0c928) && (uVar1 != 0x3ba224d0)) goto LAB_0012d0d2;
            goto LAB_0012d02c;
          }
          goto LAB_0012cfed;
        }
        if (uVar1 == 0x3b9fcb40) {
          puVar3 = (undefined4 *)ScratchAllocator::allocate_raw(alloc,0x28,0x10);
          if (puVar3 == (undefined4 *)0x0) goto LAB_0012d058;
          uVar5 = *(undefined4 *)&(this_00->allocator).impl;
          uVar6 = *(undefined4 *)((long)&(this_00->allocator).impl + 4);
          uVar7 = *(undefined4 *)&(this_00->temp_allocator).impl;
          uVar8 = *(undefined4 *)((long)&(this_00->temp_allocator).impl + 4);
          uVar9 = *(undefined4 *)&(this_00->ycbcr_temp_allocator).impl;
          uVar10 = *(undefined4 *)((long)&(this_00->ycbcr_temp_allocator).impl + 4);
          uVar11 = *(undefined4 *)&this_00->database_iface;
          uVar12 = *(undefined4 *)((long)&this_00->database_iface + 4);
          *(DatabaseInterface **)(puVar3 + 8) = this_00->module_identifier_database_iface;
          goto LAB_0012d010;
        }
        if (uVar1 != 0x3b9fe698) goto LAB_0012d0d2;
LAB_0012d02c:
        puVar3 = (undefined4 *)ScratchAllocator::allocate_raw(alloc,0x18,0x10);
        if (puVar3 == (undefined4 *)0x0) goto LAB_0012d058;
        uVar5 = *(undefined4 *)&(this_00->allocator).impl;
        uVar6 = *(undefined4 *)((long)&(this_00->allocator).impl + 4);
        uVar7 = *(undefined4 *)&(this_00->temp_allocator).impl;
        uVar8 = *(undefined4 *)((long)&(this_00->temp_allocator).impl + 4);
        *(Impl **)(puVar3 + 4) = (this_00->ycbcr_temp_allocator).impl;
LAB_0012d053:
        *puVar3 = uVar5;
        puVar3[1] = uVar6;
        puVar3[2] = uVar7;
        puVar3[3] = uVar8;
      }
LAB_0012d058:
      *ppvVar4 = puVar3;
      pNext_00 = (this_00->temp_allocator).impl;
      *(undefined8 *)(puVar3 + 2) = 0;
      ppvVar4 = (void **)(puVar3 + 2);
      this_00 = (Impl *)pnext_chain_pdf2_skip_ignored_entries(pNext_00);
    } while (this_00 != (Impl *)0x0);
  }
  *out_pnext = local_38;
  return true;
}

Assistant:

bool StateRecorder::Impl::copy_pnext_chain_pdf2(const void *pNext, ScratchAllocator &alloc, void **out_pnext)
{
	VkBaseInStructure new_pnext = {};
	const VkBaseInStructure **ppNext = &new_pnext.pNext;

	while ((pNext = pnext_chain_pdf2_skip_ignored_entries(pNext)) != nullptr)
	{
		auto *pin = static_cast<const VkBaseInStructure *>(pNext);

		switch (pin->sType)
		{
		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT:
		{
			auto *ci = static_cast<const VkPhysicalDeviceRobustness2FeaturesEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_ROBUSTNESS_FEATURES_EXT:
		{
			auto *ci = static_cast<const VkPhysicalDeviceImageRobustnessFeaturesEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_ENUMS_FEATURES_NV:
		{
			auto *ci = static_cast<const VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR:
		{
			auto *ci = static_cast<const VkPhysicalDeviceFragmentShadingRateFeaturesKHR *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_NV:
		{
			auto *ci = static_cast<const VkPhysicalDeviceMeshShaderFeaturesNV *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_EXT:
		{
			auto *ci = static_cast<const VkPhysicalDeviceMeshShaderFeaturesEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT:
		{
			auto *ci = static_cast<const VkPhysicalDeviceDescriptorBufferFeaturesEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_OBJECT_FEATURES_EXT:
		{
			auto *ci = static_cast<const VkPhysicalDeviceShaderObjectFeaturesEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PRIMITIVES_GENERATED_QUERY_FEATURES_EXT:
		{
			auto *ci = static_cast<const VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_2D_VIEW_OF_3D_FEATURES_EXT:
		{
			auto *ci = static_cast<const VkPhysicalDeviceImage2DViewOf3DFeaturesEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		default:
			LOGE_LEVEL("Cannot copy unknown pNext sType: %d.\n", int(pin->sType));
			return false;
		}

		pNext = pin->pNext;
		ppNext = const_cast<const VkBaseInStructure **>(&(*ppNext)->pNext);
		*ppNext = nullptr;
	}

	*out_pnext = (void *)new_pnext.pNext;
	return true;
}